

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O0

void __thiscall vera::Image::Image(Image *this)

{
  allocator local_11;
  Image *local_10;
  Image *this_local;
  
  this->_vptr_Image = (_func_int **)&PTR__Image_0076ca98;
  local_10 = this;
  std::__cxx11::string::string((string *)&this->name);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->m_path,"",&local_11);
  std::allocator<char>::~allocator((allocator<char> *)&local_11);
  std::vector<float,_std::allocator<float>_>::vector(&this->m_data);
  this->m_width = 0;
  this->m_height = 0;
  this->m_channels = 0;
  return;
}

Assistant:

Image::Image(): m_path(""), m_width(0), m_height(0), m_channels(0) {
}